

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError ChunkAppend(WebPChunk *chunk,WebPChunk ***chunk_list)

{
  uint8_t *puVar1;
  int iVar2;
  WebPChunk *pWVar3;
  WebPChunk *pWVar4;
  WebPChunk **ppWVar5;
  
  ppWVar5 = *chunk_list;
  pWVar4 = *ppWVar5;
  if (pWVar4 == (WebPChunk *)0x0) {
    pWVar4 = (WebPChunk *)WebPSafeMalloc(1,0x20);
    if (pWVar4 != (WebPChunk *)0x0) {
      (pWVar4->data_).size = (chunk->data_).size;
      iVar2 = chunk->owner_;
      puVar1 = (chunk->data_).bytes;
      pWVar4->tag_ = chunk->tag_;
      pWVar4->owner_ = iVar2;
      (pWVar4->data_).bytes = puVar1;
      chunk->owner_ = 0;
      pWVar4->next_ = (WebPChunk *)0x0;
      *ppWVar5 = pWVar4;
    }
  }
  else {
    do {
      pWVar3 = pWVar4;
      pWVar4 = pWVar3->next_;
    } while (pWVar4 != (WebPChunk *)0x0);
    ppWVar5 = &pWVar3->next_;
    pWVar4 = (WebPChunk *)WebPSafeMalloc(1,0x20);
    if (pWVar4 != (WebPChunk *)0x0) {
      (pWVar4->data_).size = (chunk->data_).size;
      iVar2 = chunk->owner_;
      puVar1 = (chunk->data_).bytes;
      pWVar4->tag_ = chunk->tag_;
      pWVar4->owner_ = iVar2;
      (pWVar4->data_).bytes = puVar1;
      chunk->owner_ = 0;
      pWVar4->next_ = (WebPChunk *)0x0;
      *ppWVar5 = pWVar4;
    }
    *chunk_list = ppWVar5;
  }
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAppend(WebPChunk* const chunk,
                         WebPChunk*** const chunk_list) {
  assert(chunk_list != NULL && *chunk_list != NULL);

  if (**chunk_list == NULL) {
    ChunkSetHead(chunk, *chunk_list);
  } else {
    WebPChunk* last_chunk = **chunk_list;
    while (last_chunk->next_ != NULL) last_chunk = last_chunk->next_;
    ChunkSetHead(chunk, &last_chunk->next_);
    *chunk_list = &last_chunk->next_;
  }
  return WEBP_MUX_OK;
}